

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPluginAPI.cxx
# Opt level: O1

void cmAddUtilityCommand(void *arg,char *utilityName,char *command,char *arguments,int all,
                        int numDepends,char **depends,int param_8,char **param_9)

{
  size_type sVar1;
  char *pcVar2;
  ulong uVar3;
  allocator local_e9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  int local_c4;
  cmMakefile *local_c0;
  string expand;
  cmCustomCommandLine commandLine;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  depends2;
  cmCustomCommandLines commandLines;
  
  commandLine.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  commandLine.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  commandLine.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string((string *)&expand,command,(allocator *)&local_e8);
  pcVar2 = cmMakefile::ExpandVariablesInString((cmMakefile *)arg,&expand);
  std::__cxx11::string::string((string *)&local_e8,pcVar2,(allocator *)&commandLines);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&commandLine,
             &local_e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
    operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
  }
  sVar1 = expand._M_string_length;
  local_c4 = all;
  if ((arguments != (char *)0x0) && (*arguments != '\0')) {
    strlen(arguments);
    std::__cxx11::string::_M_replace((ulong)&expand,0,(char *)sVar1,(ulong)arguments);
    pcVar2 = cmMakefile::ExpandVariablesInString((cmMakefile *)arg,&expand);
    std::__cxx11::string::string((string *)&local_e8,pcVar2,(allocator *)&commandLines);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&commandLine,
               &local_e8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
      operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
    }
  }
  commandLines.super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
  super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  commandLines.super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
  super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  commandLines.super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
  super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_c0 = (cmMakefile *)arg;
  std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::push_back
            (&commandLines.super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>,
             &commandLine);
  depends2.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  depends2.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  depends2.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (0 < numDepends) {
    uVar3 = 0;
    do {
      sVar1 = expand._M_string_length;
      pcVar2 = depends[uVar3];
      strlen(pcVar2);
      std::__cxx11::string::_M_replace((ulong)&expand,0,(char *)sVar1,(ulong)pcVar2);
      pcVar2 = cmMakefile::ExpandVariablesInString(local_c0,&expand);
      std::__cxx11::string::string((string *)&local_e8,pcVar2,&local_e9);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&depends2,
                 &local_e8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
        operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
      }
      uVar3 = uVar3 + 1;
    } while ((uint)numDepends != uVar3);
  }
  std::__cxx11::string::string((string *)&local_e8,utilityName,&local_e9);
  cmMakefile::AddUtilityCommand
            (local_c0,&local_e8,local_c4 == 0,(char *)0x0,&depends2,&commandLines,true,(char *)0x0,
             false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
    operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&depends2);
  std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::~vector
            (&commandLines.super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)expand._M_dataplus._M_p != &expand.field_2) {
    operator_delete(expand._M_dataplus._M_p,expand.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&commandLine.
             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           );
  return;
}

Assistant:

void CCONV cmAddUtilityCommand(void *arg, const char* utilityName,
                         const char* command,
                         const char* arguments,
                         int all,
                         int numDepends,
                         const char **depends,
                         int,
                         const char **)
{
  // Get the makefile instance.  Perform an extra variable expansion
  // now because the API caller expects it.
  cmMakefile* mf = static_cast<cmMakefile*>(arg);

  // Construct the command line for the command.
  cmCustomCommandLine commandLine;
  std::string expand = command;
  commandLine.push_back(mf->ExpandVariablesInString(expand));
  if(arguments && arguments[0])
    {
    // TODO: Parse arguments!
    expand = arguments;
    commandLine.push_back(mf->ExpandVariablesInString(expand));
    }
  cmCustomCommandLines commandLines;
  commandLines.push_back(commandLine);

  // Accumulate the list of dependencies.
  std::vector<std::string> depends2;
  for(int i = 0; i < numDepends; ++i)
    {
    expand = depends[i];
    depends2.push_back(mf->ExpandVariablesInString(expand));
    }

  // Pass the call to the makefile instance.
  mf->AddUtilityCommand(utilityName, (all ? false : true),
                        0, depends2, commandLines);
}